

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O3

stbi_uc stbi__get_marker(stbi__jpeg *j)

{
  stbi__context *psVar1;
  stbi_uc sVar2;
  int iVar3;
  stbi_uc sVar4;
  stbi_uc *psVar5;
  
  sVar2 = j->marker;
  if (sVar2 == 0xff) {
    psVar1 = j->s;
    psVar5 = psVar1->img_buffer;
    if (psVar5 < psVar1->img_buffer_end) {
      psVar1->img_buffer = psVar5 + 1;
      sVar4 = *psVar5;
    }
    else {
      if (psVar1->read_from_callbacks == 0) {
        return 0xff;
      }
      psVar5 = psVar1->buffer_start;
      iVar3 = (*(psVar1->io).read)(psVar1->io_user_data,(char *)psVar5,psVar1->buflen);
      if (iVar3 == 0) {
        psVar1->read_from_callbacks = 0;
        psVar5 = psVar1->buffer_start + 1;
        psVar1->buffer_start[0] = '\0';
        sVar4 = '\0';
      }
      else {
        sVar4 = *psVar5;
        psVar5 = psVar5 + iVar3;
      }
      psVar1->img_buffer_end = psVar5;
      psVar1->img_buffer = psVar1->buffer_start + 1;
    }
    sVar2 = 0xff;
    while (sVar4 == 0xff) {
      psVar1 = j->s;
      psVar5 = psVar1->img_buffer;
      if (psVar5 < psVar1->img_buffer_end) {
        psVar1->img_buffer = psVar5 + 1;
        sVar2 = *psVar5;
        sVar4 = sVar2;
      }
      else {
        if (psVar1->read_from_callbacks == 0) {
          return '\0';
        }
        psVar5 = psVar1->buffer_start;
        iVar3 = (*(psVar1->io).read)(psVar1->io_user_data,(char *)psVar5,psVar1->buflen);
        if (iVar3 == 0) {
          psVar1->read_from_callbacks = 0;
          psVar5 = psVar1->buffer_start + 1;
          psVar1->buffer_start[0] = '\0';
          sVar2 = '\0';
        }
        else {
          sVar2 = *psVar5;
          psVar5 = psVar5 + iVar3;
        }
        psVar1->img_buffer_end = psVar5;
        psVar1->img_buffer = psVar1->buffer_start + 1;
        sVar4 = sVar2;
      }
    }
  }
  else {
    j->marker = 0xff;
  }
  return sVar2;
}

Assistant:

static stbi_uc stbi__get_marker(stbi__jpeg *j)
{
   stbi_uc x;
   if (j->marker != STBI__MARKER_none) { x = j->marker; j->marker = STBI__MARKER_none; return x; }
   x = stbi__get8(j->s);
   if (x != 0xff) return STBI__MARKER_none;
   while (x == 0xff)
      x = stbi__get8(j->s); // consume repeated 0xff fill bytes
   return x;
}